

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-stairs.c
# Opt level: O1

_Bool borg_flow_stair_both(int why,_Bool sneak)

{
  _Bool _Var1;
  long lVar2;
  
  if ((track_more.num != 0 || track_less.num != 0) &&
     ((((((borg.goal.fleeing || (track_less.num != 0)) || (scaryguy_on_level)) ||
        ((borg.trait[0x1b] * 0xf) / 10 < (int)avoidance)) ||
       (((borg.trait[0x6c] == 0 && (borg.trait[0x6d] == 0)) && (1 < borg.trait[0x27])))) &&
      (((borg.trait[0x1a] != 0 || (borg.trait[0x69] == 0)) || (borg.munchkin_mode)))))) {
    borg_flow_clear();
    if (0 < track_less.num) {
      lVar2 = 0;
      do {
        if (borg_grids[track_less.y[lVar2]][track_less.x[lVar2]].kill == '\0') {
          borg_flow_enqueue_grid(track_less.y[lVar2],track_less.x[lVar2]);
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < track_less.num);
    }
    if (0 < track_more.num) {
      lVar2 = 0;
      do {
        if (borg_grids[track_more.y[lVar2]][track_more.x[lVar2]].kill == '\0') {
          borg_flow_enqueue_grid(track_more.y[lVar2],track_more.x[lVar2]);
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < track_more.num);
    }
    borg_flow_spread(L'ú',false,false,false,L'\xffffffff',sneak);
    _Var1 = borg_flow_commit("stairs",why);
    if (_Var1) {
      _Var1 = borg_flow_old(why);
      return _Var1;
    }
  }
  return false;
}

Assistant:

bool borg_flow_stair_both(int why, bool sneak)
{
    int i;

    /* None to flow to */
    if (!track_less.num && !track_more.num)
        return false;

    /* don't go down if hungry or low on food, unless fleeing a scary town */
    if (!borg.goal.fleeing && !scaryguy_on_level && !track_less.num
        && (avoidance <= borg.trait[BI_CURHP] * 15 / 10)
        && (borg.trait[BI_ISWEAK] || borg.trait[BI_ISHUNGRY]
            || borg.trait[BI_FOOD] < 2))
        return false;

    /* Absolutely no diving if no light */
    if (borg.trait[BI_LIGHT] == 0 && borg.trait[BI_CDEPTH] != 0
        && borg.munchkin_mode == false)
        return false;

    /* Clear the flow codes */
    borg_flow_clear();

    /* Enqueue useful grids */
    for (i = 0; i < track_less.num; i++) {
        /* Not if a monster is parked on the stair */
        if (borg_grids[track_less.y[i]][track_less.x[i]].kill)
            continue;

        /* Enqueue the grid */
        borg_flow_enqueue_grid(track_less.y[i], track_less.x[i]);
    }

    /* Enqueue useful grids */
    for (i = 0; i < track_more.num; i++) {
        /* Not if a monster is parked on the stair */
        if (borg_grids[track_more.y[i]][track_more.x[i]].kill)
            continue;

        /* Enqueue the grid */
        borg_flow_enqueue_grid(track_more.y[i], track_more.x[i]);
    }

    /* Spread the flow */
    borg_flow_spread(250, false, false, false, -1, sneak);

    /* Attempt to Commit the flow */
    if (!borg_flow_commit("stairs", why))
        return false;

    /* Take one step */
    if (!borg_flow_old(why))
        return false;

    /* Success */
    return true;
}